

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

void pybind11::detail::loader_life_support::add_patient(handle h)

{
  loader_life_support *plVar1;
  cast_error *this;
  __ireturn_type _Var2;
  handle h_local;
  
  h_local = h;
  plVar1 = get_stack_top();
  if (plVar1 != (loader_life_support *)0x0) {
    _Var2 = std::__detail::
            _Insert_base<_object_*,__object_*,_std::allocator<_object_*>,_std::__detail::_Identity,_std::equal_to<_object_*>,_std::hash<_object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<_object_*,__object_*,_std::allocator<_object_*>,_std::__detail::_Identity,_std::equal_to<_object_*>,_std::hash<_object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&plVar1->keep_alive,&h_local.m_ptr);
    if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (h_local.m_ptr)->ob_refcnt = (h_local.m_ptr)->ob_refcnt + 1;
    }
    return;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  cast_error::runtime_error
            (this,
             "When called outside a bound function, py::cast() cannot do Python -> C++ conversions which require the creation of temporary values"
            );
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PYBIND11_NOINLINE static void add_patient(handle h) {
        loader_life_support *frame = get_stack_top();
        if (!frame) {
            // NOTE: It would be nice to include the stack frames here, as this indicates
            // use of pybind11::cast<> outside the normal call framework, finding such
            // a location is challenging. Developers could consider printing out
            // stack frame addresses here using something like __builtin_frame_address(0)
            throw cast_error("When called outside a bound function, py::cast() cannot "
                             "do Python -> C++ conversions which require the creation "
                             "of temporary values");
        }

        if (frame->keep_alive.insert(h.ptr()).second) {
            Py_INCREF(h.ptr());
        }
    }